

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  ValueHolder VVar8;
  byte *pbVar9;
  ulong uVar10;
  ushort uVar11;
  ulong uVar12;
  ValueHolder *this_00;
  ValueHolder local_d0;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  ValueHolder local_a8;
  ushort local_a0;
  ValueHolder local_80;
  ushort local_78;
  ValueHolder local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  cVar1 = *token->start_;
  uVar12 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar9 = (byte *)(token->start_ + (cVar1 == '-'));
  bVar4 = false;
  uVar10 = 0;
  while( true ) {
    if (token->end_ <= pbVar9) break;
    bVar2 = *pbVar9;
    pbVar9 = pbVar9 + 1;
    if (((byte)(bVar2 - 0x3a) < 0xf6) ||
       ((uVar7 = (ulong)(bVar2 - 0x30), uVar12 / 10 <= uVar10 &&
        (((uVar12 / 10 < uVar10 || (pbVar9 != (byte *)token->end_)) || (uVar12 % 10 < uVar7)))))) {
      bVar4 = decodeDouble(this,token,decoded);
      bVar3 = false;
    }
    else {
      uVar10 = uVar7 + uVar10 * 10;
      bVar3 = true;
    }
    if (!bVar3) {
      return bVar4;
    }
  }
  if ((cVar1 == '-') && (uVar10 == uVar12)) {
    this_00 = &local_58;
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    local_58.int_ = -0x8000000000000000;
    uVar5 = *(ushort *)&decoded->field_0x8;
    uVar11 = (uVar5 & 0xff00) + 1;
    *(ushort *)&decoded->field_0x8 = uVar11;
    uVar6 = uVar5 & 0xff | (ushort)local_50 & 0xfe00;
    local_50 = CONCAT22((short)((uint)local_50 >> 0x10),uVar6);
    VVar8 = decoded->value_;
    (decoded->value_).int_ = -0x8000000000000000;
  }
  else {
    if (cVar1 == '-') {
      this_00 = &local_80;
      uVar10 = -uVar10;
    }
    else {
      if (0x7fffffff < uVar10) {
        this_00 = &local_d0;
        local_c0 = 0;
        uStack_b8 = 0;
        local_b0 = 0;
        uVar5 = *(ushort *)&decoded->field_0x8;
        *(ushort *)&decoded->field_0x8 = uVar5 & 0xff00 | 2;
        uVar6 = uVar5 & 0xff | (ushort)local_c8 & 0xfe00;
        local_c8 = CONCAT22((short)((uint)local_c8 >> 0x10),uVar6);
        local_d0 = decoded->value_;
        (decoded->value_).uint_ = uVar10;
        uVar11 = uVar5 & 0xfe00 | 2;
        goto LAB_0010d33f;
      }
      this_00 = &local_a8;
      local_78 = local_a0;
    }
    *(ushort *)(this_00 + 1) = (local_78 & 0xfe00) + 1;
    this_00[2].int_ = 0;
    this_00[3].int_ = 0;
    this_00[4].int_ = 0;
    this_00->int_ = uVar10;
    uVar5 = *(ushort *)&decoded->field_0x8;
    uVar11 = (uVar5 & 0xff00) + 1;
    *(ushort *)&decoded->field_0x8 = uVar11;
    uVar6 = uVar5 & 0xff | local_78 & 0xfe00;
    *(ushort *)(this_00 + 1) = uVar6;
    VVar8 = decoded->value_;
    (decoded->value_).int_ = uVar10;
  }
  *this_00 = VVar8;
  uVar11 = uVar11 & 0xfe01;
LAB_0010d33f:
  *(ushort *)&decoded->field_0x8 = uVar11;
  *(ushort *)(this_00 + 1) = uVar6 | uVar5 & 0x100;
  VVar8 = (ValueHolder)decoded->comments_;
  decoded->comments_ = (CommentInfo *)this_00[2];
  this_00[2] = VVar8;
  VVar8 = (ValueHolder)decoded->start_;
  decoded->start_ = (ptrdiff_t)this_00[3];
  this_00[3] = VVar8;
  VVar8 = (ValueHolder)decoded->limit_;
  decoded->limit_ = (ptrdiff_t)this_00[4];
  this_00[4] = VVar8;
  Value::~Value((Value *)this_00);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    Value::UInt digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}